

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastBS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  uint64_t uVar3;
  TcParseTableBase *this;
  byte bVar4;
  bool bVar5;
  unsigned_short uVar6;
  uint16_t uVar7;
  uint uVar8;
  char *pcVar9;
  uint *puVar10;
  ulong uVar11;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_188;
  Arena *local_180;
  Arena *arena;
  ArenaStringPtr *field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_168;
  unsigned_short saved_tag;
  uint64_t local_160;
  TcParseTableBase *local_158;
  ParseContext *local_150;
  char *local_148;
  MessageLite *local_140;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_138;
  TcFieldData local_130;
  TcFieldData local_128;
  undefined1 local_119;
  ulong uStack_118;
  bool always_return;
  TcParseTableBase *local_110;
  ParseContext *local_108;
  char *local_100;
  MessageLite *local_f8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_f0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_e8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_e0;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  
  local_160 = hasbits;
  local_158 = table;
  local_150 = ctx;
  local_148 = ptr;
  local_140 = msg;
  local_138 = data.field_0;
  uVar6 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)&local_138);
  pMVar2 = local_140;
  pcVar9 = local_148;
  pPVar1 = local_150;
  if (uVar6 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffe98);
    pcVar9 = MiniParse(pMVar2,pcVar9,pPVar1,(TcFieldData)aStack_168,local_158,local_160);
    return pcVar9;
  }
  field._6_2_ = UnalignedLoad<unsigned_short>(local_148);
  local_148 = local_148 + 2;
  bVar4 = TcFieldData::hasbit_idx((TcFieldData *)&local_138);
  pMVar2 = local_140;
  local_160 = 1L << (bVar4 & 0x3f) | local_160;
  uVar7 = TcFieldData::offset((TcFieldData *)&local_138);
  arena = (Arena *)RefAt<google::protobuf::internal::ArenaStringPtr>(pMVar2,(ulong)uVar7);
  local_180 = MessageLite::GetArena(local_140);
  pMVar2 = local_140;
  pcVar9 = local_148;
  pPVar1 = local_150;
  if (local_180 == (Arena *)0x0) {
    bVar4 = TcFieldData::aux_idx((TcFieldData *)&local_138);
    local_148 = anon_unknown_104::ReadStringNoArena
                          (pMVar2,pcVar9,pPVar1,(uint)bVar4,local_158,(ArenaStringPtr *)arena);
  }
  else {
    TcFieldData::aux_idx((TcFieldData *)&local_138);
    local_148 = EpsCopyInputStream::ReadArenaString
                          (&pPVar1->super_EpsCopyInputStream,pcVar9,(ArenaStringPtr *)arena,
                           local_180);
  }
  pMVar2 = local_140;
  pcVar9 = local_148;
  pPVar1 = local_150;
  if (local_148 == (char *)0x0) {
    anon_unknown_104::EnsureArenaStringIsNotDefault(local_140,(ArenaStringPtr *)arena);
    pMVar2 = local_140;
    pcVar9 = local_148;
    pPVar1 = local_150;
    TcFieldData::TcFieldData((TcFieldData *)&local_188);
    pcVar9 = Error(pMVar2,pcVar9,pPVar1,(TcFieldData)local_188,local_158,local_160);
    return pcVar9;
  }
  TcFieldData::TcFieldData(&data_local);
  local_f0 = data_local.field_0;
  local_f8 = pMVar2;
  local_100 = pcVar9;
  local_108 = pPVar1;
  local_110 = local_158;
  uStack_118 = local_160;
  local_119 = 0;
  bVar5 = EpsCopyInputStream::DataAvailable(&pPVar1->super_EpsCopyInputStream,pcVar9);
  pMVar2 = local_f8;
  pcVar9 = local_100;
  pPVar1 = local_108;
  if (!bVar5) {
    TcFieldData::TcFieldData(&local_128);
    if (local_110->has_bits_offset != 0) {
      uVar8 = (uint)uStack_118;
      puVar10 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_110->has_bits_offset);
      *puVar10 = uVar8 | *puVar10;
    }
    return pcVar9;
  }
  TcFieldData::TcFieldData(&local_130);
  this = local_110;
  uVar3 = uStack_118;
  uVar6 = UnalignedLoad<unsigned_short>(pcVar9);
  uVar11 = (ulong)(int)((uint)uVar6 & (uint)this->fast_idx_mask);
  if ((uVar11 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  data_1.field_0 =
       (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(this,uVar11 >> 3);
  local_e0.data =
       ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
       (ulong)uVar6;
  UNRECOVERED_JUMPTABLE = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0)
  ;
  local_e8.data = local_e0.data;
  pcVar9 = (*UNRECOVERED_JUMPTABLE)(pMVar2,pcVar9,pPVar1,(TcFieldData)local_e0,this,uVar3);
  return pcVar9;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastBS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint16_t, ArenaStringPtr, kNoUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}